

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hlcv.c
# Opt level: O0

ErrorNumber test_func_per_hlcv(TA_History *history)

{
  ErrorNumber EVar1;
  uint *in_RDI;
  ErrorNumber retValue;
  uint i;
  TA_Test_conflict8 *in_stack_00000068;
  TA_History *in_stack_00000070;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    if (0x17 < local_14) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    if ((int)*in_RDI < tableTest[local_14].expectedNbElement) break;
    EVar1 = do_test(in_stack_00000070,in_stack_00000068);
    if (EVar1 != TA_TEST_PASS) {
      printf("Failed Test #%d (Code=%d)\n",(ulong)local_14,(ulong)EVar1);
      return EVar1;
    }
    local_14 = local_14 + 1;
  }
  printf("Failed Bad Parameter for Test #%d (%d,%d)\n",(ulong)local_14,
         (ulong)(uint)tableTest[local_14].expectedNbElement,(ulong)*in_RDI);
  return TA_TESTUTIL_TFRR_BAD_PARAM;
}

Assistant:

ErrorNumber test_func_per_hlcv( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;


   for( i=0; i < NB_TEST; i++ )
   {
      /* Re-initialize all the unstable period to zero. */
      TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}